

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logic.cpp
# Opt level: O3

void __thiscall Logic::Run(Logic *this,QLearning *q,int *r)

{
  vector<int,_std::allocator<int>_> *__k;
  map<std::vector<int,_std::allocator<int>_>,_std::vector<float,_std::allocator<float>_>,_std::less<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_std::vector<float,_std::allocator<float>_>_>_>_>
  *this_00;
  pointer piVar1;
  pointer piVar2;
  Logic *pLVar3;
  float fVar4;
  float *pfVar5;
  bool bVar6;
  char cVar7;
  int iVar8;
  time_t tVar9;
  mapped_type *pmVar10;
  ulong uVar11;
  ostream *poVar12;
  long lVar13;
  float *pfVar14;
  undefined8 uVar15;
  long lVar16;
  float *pfVar17;
  long lVar18;
  bool bVar19;
  ulong uVar20;
  long lVar21;
  int iVar22;
  float fVar23;
  vector<float,_std::allocator<float>_> max_future;
  Player p;
  Mat Picture;
  vector<float,_std::allocator<float>_> local_158;
  undefined8 uStack_140;
  int local_12c;
  float *local_128;
  float *pfStack_120;
  long local_118;
  QLearning *local_110;
  _InputArray local_108;
  double local_f0;
  double local_e8;
  Logic *local_e0;
  int local_d8;
  int local_d4;
  int local_d0;
  int local_cc;
  Player local_c8;
  int *local_b8;
  undefined8 local_b0;
  float *local_a8;
  float *pfStack_a0;
  long local_98;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  __k = &this->_observations;
  this_00 = &q->_q_table;
  local_48 = 0;
  uStack_44 = 0;
  uStack_40 = 0;
  uStack_3c = 0x406fe000;
  local_12c = 0;
  local_110 = q;
  local_e0 = this;
  local_b8 = r;
  do {
    Player::Player(&local_c8,*local_b8);
    local_128 = (float *)0x0;
    pfStack_120 = (float *)0x0;
    local_118 = 0;
    local_e8 = 0.0;
    iVar22 = 0;
    do {
      local_a8 = (float *)CONCAT44(local_c8.y,local_c8.x);
      std::vector<int,std::allocator<int>>::_M_assign_aux<int_const*>
                ((vector<int,std::allocator<int>> *)&local_128,(Mat *)&local_a8,&pfStack_a0);
      piVar2 = Player::_goal.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar16 = (long)pfStack_120 - (long)local_128 >> 2;
      lVar13 = (long)Player::_goal.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)Player::_goal.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start >> 2;
      piVar1 = (__k->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
               _M_start;
      lVar21 = 0;
      bVar6 = true;
      do {
        bVar19 = bVar6;
        lVar18 = lVar16;
        if ((lVar21 == lVar16) || (lVar18 = lVar13, lVar21 == lVar13)) {
          uVar11 = std::__throw_out_of_range_fmt
                             ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                              ,lVar18);
          goto LAB_0010535d;
        }
        piVar1[lVar21] = (int)local_128[lVar21] - piVar2[lVar21];
        lVar21 = 1;
        bVar6 = false;
      } while (bVar19);
      tVar9 = time((time_t *)0x0);
      srand((uint)tVar9);
      iVar8 = rand();
      fVar23 = QLearning::GetEpsilon(local_110);
      if ((float)iVar8 / 2.1474836e+09 <= fVar23) {
        iVar8 = rand();
        iVar8 = iVar8 % local_110->_actionSize;
        local_e0->_action = iVar8;
      }
      else {
        pmVar10 = std::
                  map<std::vector<int,_std::allocator<int>_>,_std::vector<float,_std::allocator<float>_>,_std::less<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_std::vector<float,_std::allocator<float>_>_>_>_>
                  ::operator[](this_00,__k);
        std::vector<float,_std::allocator<float>_>::vector
                  ((vector<float,_std::allocator<float>_> *)&local_a8,pmVar10);
        pLVar3 = local_e0;
        pfVar14 = local_a8 + 1;
        pfVar17 = local_a8;
        if (pfVar14 != pfStack_a0 && local_a8 != pfStack_a0) {
          fVar23 = *local_a8;
          do {
            fVar4 = *pfVar14;
            pfVar5 = pfVar14;
            if (*pfVar14 <= fVar23) {
              fVar4 = fVar23;
              pfVar5 = pfVar17;
            }
            pfVar17 = pfVar5;
            fVar23 = fVar4;
            pfVar14 = pfVar14 + 1;
          } while (pfVar14 != pfStack_a0);
        }
        iVar8 = (int)((ulong)((long)pfVar17 - (long)local_a8) >> 2);
        local_e0->_action = iVar8;
        if (local_a8 != (float *)0x0) {
          operator_delete(local_a8,local_98 - (long)local_a8);
          iVar8 = pLVar3->_action;
        }
      }
      Player::action((vector<int,_std::allocator<int>_> *)&local_a8,&local_c8,iVar8);
      lVar13 = local_118;
      pfVar14 = local_128;
      local_128 = local_a8;
      pfStack_120 = pfStack_a0;
      local_118 = local_98;
      local_a8 = (float *)0x0;
      pfStack_a0 = (float *)0x0;
      local_98 = 0;
      if ((pfVar14 != (float *)0x0) &&
         (operator_delete(pfVar14,lVar13 - (long)pfVar14), local_a8 != (float *)0x0)) {
        operator_delete(local_a8,local_98 - (long)local_a8);
      }
      uVar20 = (long)pfStack_120 - (long)local_128 >> 2;
      if (pfStack_120 == local_128) {
        uVar15 = 0;
LAB_00105366:
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                   uVar15,uVar20);
        goto LAB_0010537a;
      }
      uVar11 = (long)Player::_goal.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)Player::_goal.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start >> 2;
      if (Player::_goal.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          Player::_goal.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start) {
LAB_0010535d:
        uVar20 = uVar11;
        uVar15 = 0;
        goto LAB_00105366;
      }
      uVar15 = 1;
      if ((uVar20 < 2) || (uVar20 = uVar11, uVar11 < 2)) goto LAB_00105366;
      if (local_128[1] ==
          (float)Player::_goal.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[1] &&
          *local_128 ==
          (float)*Player::_goal.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Goal reached",0xc)
        ;
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x10);
        std::ostream::put(-0x10);
        std::ostream::flush();
        break;
      }
      local_a8 = (float *)0x0;
      pfStack_a0 = (float *)0x0;
      local_98 = 0;
      local_f0 = (double)((((int)*local_128 + (int)local_128[1]) -
                          *Player::_goal.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start) -
                         Player::_goal.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[1]) + 0.001;
      std::
      transform<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::back_insert_iterator<std::vector<int,std::allocator<int>>>,std::minus<int>>
                ();
      local_158.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_158.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_158.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      pmVar10 = std::
                map<std::vector<int,_std::allocator<int>_>,_std::vector<float,_std::allocator<float>_>,_std::less<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_std::vector<float,_std::allocator<float>_>_>_>_>
                ::operator[](this_00,(key_type *)&local_a8);
      std::vector<float,_std::allocator<float>_>::operator=(&local_158,pmVar10);
      std::
      map<std::vector<int,_std::allocator<int>_>,_std::vector<float,_std::allocator<float>_>,_std::less<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_std::vector<float,_std::allocator<float>_>_>_>_>
      ::operator[](this_00,__k);
      std::
      map<std::vector<int,_std::allocator<int>_>,_std::vector<float,_std::allocator<float>_>,_std::less<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_std::vector<float,_std::allocator<float>_>_>_>_>
      ::operator[](this_00,__k);
      if ((pointer *)
          local_158.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer *)0x0) {
        operator_delete(local_158.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_158.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_158.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_a8 != (float *)0x0) {
        operator_delete(local_a8,local_98 - (long)local_a8);
      }
      local_e8 = local_e8 + 1.0 / local_f0;
      iVar22 = iVar22 + 1;
    } while (iVar22 != 200);
    fVar23 = QLearning::GetEpsilon(local_110);
    local_f0 = (double)CONCAT44(local_f0._4_4_,fVar23);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"#----------------------",0x17);
    poVar12 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_12c);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12," Episode Reward: ",0x11);
    poVar12 = std::ostream::_M_insert<double>(local_e8);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
    std::ostream::put((char)poVar12);
    std::ostream::flush();
    QLearning::SetEpsilon(local_110,local_f0._0_4_ * QLearning::_EPS_DECAY);
    local_158.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    uStack_140 = 0;
    local_158.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_158.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    cv::Mat::Mat((Mat *)&local_a8,0x140,0xf0,0x10,(Scalar_ *)&local_158);
    cVar7 = cv::Mat::empty();
    if (cVar7 != '\0') {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Could not instantiate the image",0x1f);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x10);
      std::ostream::put(-0x10);
      std::ostream::flush();
      std::istream::get();
    }
    local_158.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_158.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)CONCAT44(local_158.super__Vector_base<float,_std::allocator<float>_>._M_impl
                                 .super__Vector_impl_data._M_start._4_4_,0x1010000);
    uVar15 = 0;
    local_108.sz.width = 0;
    local_108.sz.height = 0;
    local_108.flags = 0x2010000;
    local_b0 = 0x1f4000001f4;
    local_158.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)&local_a8;
    local_108.obj = (Mat *)&local_a8;
    cv::resize(0,0,&local_158,&local_108,&local_b0,1);
    local_108.sz.width = 0;
    local_108.sz.height = 0;
    local_108.flags = 0x3010000;
    local_108.obj = (Mat *)&local_a8;
    if (Player::_goal.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish ==
        Player::_goal.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start) {
LAB_0010537f:
      uVar15 = std::__throw_out_of_range_fmt
                         ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                          ,uVar15);
      if ((pointer *)
          local_158.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer *)0x0) {
        operator_delete(local_158.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_158.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_158.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_a8 != (float *)0x0) {
        operator_delete(local_a8,local_98 - (long)local_a8);
      }
      if (local_128 != (float *)0x0) {
        operator_delete(local_128,local_118 - (long)local_128);
      }
      _Unwind_Resume(uVar15);
    }
    if ((ulong)((long)Player::_goal.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)Player::_goal.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start >> 2) < 2) {
LAB_0010537a:
      uVar15 = 1;
      goto LAB_0010537f;
    }
    local_d0 = *Player::_goal.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start * 0x14;
    local_cc = Player::_goal.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[1] * 0x14;
    local_158.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)CONCAT44(uStack_44,local_48);
    local_158.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)CONCAT44(uStack_3c,uStack_40);
    local_158.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    uStack_140 = 0;
    cv::circle(&local_108,&local_d0,0x14,(string *)&local_158,2,8,0);
    local_d8 = local_c8.x * 0x14;
    local_d4 = local_c8.y * 0x14;
    local_108.sz.width = 0;
    local_108.sz.height = 0;
    local_108.flags = 0x3010000;
    local_158.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x406fe00000000000;
    local_158.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_158.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x406fe00000000000;
    uStack_140 = 0;
    local_108.obj = (Mat *)&local_a8;
    cv::circle(&local_108,&local_d8,0x14,(string *)&local_158,0xfffffffe,8,0);
    local_158.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)&local_158.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_158,"Path planner Reinforcement-Learning","");
    local_108.sz.width = 0;
    local_108.sz.height = 0;
    local_108.flags = 0x1010000;
    local_108.obj = (Mat *)&local_a8;
    cv::imshow((string *)&local_158,&local_108);
    if ((pointer *)
        local_158.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        &local_158.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
         ._M_end_of_storage) {
      operator_delete(local_158.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_158.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage + 1);
    }
    cv::waitKey(10);
    local_158.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)&local_158.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_158,"Path planner Reinforcement-Learning","");
    cv::destroyWindow((string *)&local_158);
    if ((pointer *)
        local_158.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        &local_158.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
         ._M_end_of_storage) {
      operator_delete(local_158.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_158.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage + 1);
    }
    cv::Mat::~Mat((Mat *)&local_a8);
    if (local_128 != (float *)0x0) {
      operator_delete(local_128,local_118 - (long)local_128);
    }
    local_12c = local_12c + 1;
    if (local_12c == 5000) {
      return;
    }
  } while( true );
}

Assistant:

void Logic::Run(QLearning &q, const int &r)
{

    //int k = erl::QLearning::_EPISODES;

    for (int i = 0; i < 5000; i++)
    {
        Player p(r);
        double episode_reward = 0;
        std::vector<int> player_pos;

        for (int j = 0; j < 200; j++)
        {
            player_pos = {p.x, p.y};
            //std::cout << "Previous position " << p.x << " " << p.y << std::endl;
            // std::transform(player_pos.begin(),player_pos.end(),(p.GetGoal()).begin(), std::back_inserter(_observations),std::minus<int>()); //to be completed
            for (int i = 0; i < 2; i++)
            {
                _observations[i] = player_pos.at(i) - Player::_goal.at(i);
            }
            //std::cout<<"Observation<<"<<_observations[0]<< " "<<_observations[1]<<" " <<_observations[2]<<std::endl;
            //
            srand((unsigned)time(NULL));
            //std::cout<<q.GetEpsilon()<<std::endl;

            if (((double)rand() / (RAND_MAX)) > q.GetEpsilon())
            {
                //std::cout<<((double) rand() / (RAND_MAX)) <<std::endl;
                std::vector<float> vec = q._q_table[_observations];
                _action = arg_max(vec);
                //std::cout<<"action selected is "<<_action<<std::endl;
            }
            else
            {
                _action = (int)rand() % (q._actionSize) + 0;
                //std::cout<<"action selected is "<<_action<<std::endl;
                //std::cout<<"exit "<<((double) rand() / (RAND_MAX))<<std::endl;
            }
            player_pos = p.action(_action);
            //Play around with the reward function                                                //Player takes action in this stage
            double reward = 1 / ((player_pos.at(0) -  Player::_goal.at(0)) + (player_pos.at(1) -  Player::_goal.at(1)) + 0.001); //Assuming we had a vector with 2 states
            //std::cout<<reward<<std::endl;

            //std::cout << "New position " << player_pos.at(0) << " " << player_pos.at(1) << std::endl;

            if (player_pos.at(0) ==  Player::_goal.at(0) && player_pos.at(1) ==  Player::_goal.at(1))
            {
                std::cout << "Goal reached" << std::endl;
                break;
            }

            std::vector<int> new_obs;
            std::transform(player_pos.begin(), player_pos.end(), (Player::_goal).begin(), std::back_inserter(new_obs), std::minus<int>());
            //std::cout << "New Observation<<" << new_obs[0] << " " << new_obs[1] << " " << std::endl;

            std::vector<float> max_future;
            try
            {
                max_future = q._q_table[new_obs];
            }
            catch (const std::exception &er)
            {
                std::cout << "Error caught" << er.what() << std::endl;
            }
            std::vector<float>::iterator max_future_q;
            try
            {                                                                             //get all qvalues corresponding next best state
                max_future_q = max_element(std::begin(max_future), std::end(max_future)); // c++11
            }
            catch (const std::exception &er)
            {
                std::cout << "Error caught" << er.what() << std::endl;
            }
            //std::cout << "Observation<<" << _observations[0] << " " << _observations[1] << std::endl;
            //std::cout << "Action<<" << _action << std::endl;
            //std::cout<<q._q_table[_observations][_action]<<std::endl;
            float current_q;
            try
            {
                float current_q = q._q_table[_observations][_action];
            } //get the best qvalue corresponding next best state
            catch (const std::exception &er)
            {
                std::cout << "Error caught" << er.what() << std::endl;
            }
            //std::cout<<current_q<<std::endl;
            float new_q;
            try
            {
                float new_q = (1 - QLearning::_LEARNING_RATE) * current_q + QLearning::_LEARNING_RATE * (reward + QLearning::_DISCOUNT * (*max_future_q));
            }
            catch (const std::exception &er)
            {
                std::cout << "Error caught" << er.what() << std::endl;
            }

            try
            {
                q._q_table[_observations][_action] = new_q;
            }
            catch (const std::exception &er)
            {
                std::cout << "Error caught" << er.what() << std::endl;
            }
            episode_reward += reward;

            //
            //
            //
            //
        }

        float ep = q.GetEpsilon();
        std::cout << "#----------------------" << i << " Episode Reward: " << episode_reward << std::endl;
        q.SetEpsilon(ep * (QLearning::_EPS_DECAY)); //Epsilon Decay;
        //     // Read the image file

        Mat Picture(320, 240, CV_8UC3, cv::Scalar(0, 0, 0));
        // Check for failure
        if (Picture.empty())
        {
            std::cout << "Could not instantiate the image" << std::endl;
            std::cin.get(); //wait for any key press
        }

        resize(Picture, Picture, Size(500, 500));

        //A Parameters x (start in x axes horizontal) y (start in vertical)

        // w (vertical lenght)  h (Horizontal lenght)

        //Rect RectangleToDraw(2, 2, 100, 100);
        //Scaling by 20
        circle(Picture, Point(Player::_goal.at(0)*20, Player::_goal.at(1)*20), 20, Scalar(0, 255, 0), 2, 8, 0);

        Point p1 = Point(20 * p.x, 20 * p.y);
        circle(Picture, p1, 20, Scalar(255, 0, 255), -2, 8, 0);

        imshow("Path planner Reinforcement-Learning", Picture);
        waitKey(10);
        destroyWindow("Path planner Reinforcement-Learning");
    }
}